

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

cmValue __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  string_view *__t;
  __type _Var3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  cmValue cVar10;
  cmState *this_00;
  string *__return_storage_ptr__;
  long lVar11;
  pointer this_01;
  undefined1 *this_02;
  undefined1 auVar12 [16];
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  string_view str;
  string_view str_00;
  undefined1 local_429;
  FileSetType *fileSetTypes [2];
  cmStateSnapshot local_400;
  string fileSetName;
  UsageRequirementProperty *local_3c8;
  long lStack_3c0;
  UsageRequirementProperty *local_3b8;
  long lStack_3b0;
  UsageRequirementProperty *local_3a8;
  long lStack_3a0;
  UsageRequirementProperty *local_398;
  long lStack_390;
  UsageRequirementProperty *local_388;
  long lStack_380;
  UsageRequirementProperty *local_378;
  long lStack_370;
  UsageRequirementProperty *local_368 [4];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar5 != 0)) {
    std::__cxx11::string::string
              ((string *)&fileSetName,(string *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)&local_3c8,(string *)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)&local_3a8,(string *)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)&local_388,(string *)(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)local_368,(string *)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_348,(string *)(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_328,(string *)(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    std::__cxx11::string::string(local_308,(string *)(anonymous_namespace)::propTYPE_abi_cxx11_);
    std::__cxx11::string::string
              (local_2e8,(string *)(anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_2c8,(string *)(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
    std::__cxx11::string::string
              (local_2a8,(string *)(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_288,(string *)(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_268,(string *)(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
    std::__cxx11::string::string
              (local_248,(string *)(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_228,(string *)(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string(local_208,(string *)(anonymous_namespace)::propIMPORTED_abi_cxx11_)
    ;
    std::__cxx11::string::string
              (local_1e8,(string *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
    std::__cxx11::string::string
              (local_1c8,(string *)(anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
              );
    std::__cxx11::string::string(local_1a8,(string *)(anonymous_namespace)::propNAME_abi_cxx11_);
    std::__cxx11::string::string
              (local_188,(string *)(anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
    std::__cxx11::string::string
              (local_168,(string *)(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
    std::__cxx11::string::string(local_148,(string *)(anonymous_namespace)::propSOURCES_abi_cxx11_);
    std::__cxx11::string::string
              (local_128,(string *)(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_108,
               (string *)(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
    std::__cxx11::string::string
              (local_e8,(string *)
                        (anonymous_namespace)::
                        propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
    std::__cxx11::string::string
              (local_c8,(string *)
                        (anonymous_namespace)::
                        propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_a8,(string *)
                        (anonymous_namespace)::
                        propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_88,(string *)
                        (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_FEATURES_abi_cxx11_)
    ;
    std::__cxx11::string::string
              (local_68,(string *)
                        (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_48,(string *)
                        (anonymous_namespace)::propIMPORTED_CXX_MODULES_LINK_LIBRARIES_abi_cxx11_);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,&fileSetName,
               &stack0xffffffffffffffd8,0,fileSetTypes,&local_400,&local_429);
    lVar11 = 0x3a0;
    do {
      std::__cxx11::string::~string((string *)((long)&fileSetName._M_dataplus._M_p + lVar11));
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != -0x20);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  sVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_._M_h,prop);
  if (sVar6 != 0) {
    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    if (((((_Var3) ||
          (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_),
          _Var3)) ||
         (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_),
         _Var3)) ||
        ((_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_), _Var3
         || (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_),
            _Var3)))) ||
       (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_),
       _Var3)) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::find(&(((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LanguageStandardProperties)._M_t,prop);
      if (iVar7._M_node !=
          (_Base_ptr)
          ((long)&((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                  LanguageStandardProperties + 8U)) {
        return (cmValue)(iVar7._M_node + 2);
      }
      return (cmValue)(_Base_ptr)0x0;
    }
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    auVar12._8_4_ = (int)_Var1._M_head_impl;
    auVar12._0_8_ = _Var1._M_head_impl;
    auVar12._12_4_ = (int)((ulong)_Var1._M_head_impl >> 0x20);
    lVar11 = auVar12._8_8_;
    fileSetName.field_2._M_allocated_capacity = (size_type)&(_Var1._M_head_impl)->CompileFeatures;
    fileSetName.field_2._8_8_ = lVar11 + 0x328;
    fileSetName._M_dataplus._M_p = (pointer)&(_Var1._M_head_impl)->IncludeDirectories;
    fileSetName._M_string_length = lVar11 + 0x2c8;
    local_3b8 = &(_Var1._M_head_impl)->LinkOptions;
    lStack_3b0 = lVar11 + 1000;
    local_3c8 = &(_Var1._M_head_impl)->PrecompileHeaders;
    lStack_3c0 = lVar11 + 0x388;
    local_398 = &(_Var1._M_head_impl)->InterfaceLinkLibrariesDirect;
    lStack_390 = lVar11 + 0x4a8;
    local_3a8 = &(_Var1._M_head_impl)->LinkLibraries;
    lStack_3a0 = lVar11 + 0x448;
    local_378 = &(_Var1._M_head_impl)->ImportedCxxModulesCompileFeatures;
    lStack_370 = lVar11 + 0x568;
    local_388 = &(_Var1._M_head_impl)->ImportedCxxModulesIncludeDirectories;
    lStack_380 = lVar11 + 0x508;
    local_368[0] = &(_Var1._M_head_impl)->ImportedCxxModulesLinkLibraries;
    lVar11 = 0;
LAB_002ddf66:
    if (lVar11 != 0x88) goto code_r0x002ddf6f;
    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::propTYPE_abi_cxx11_);
    if (_Var3) {
      p_Var8 = (_Base_ptr)
               cmState::GetTargetTypeName_abi_cxx11_
                         (((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          TargetType);
      return (cmValue)p_Var8;
    }
    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::
                                    propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    if (_Var3) {
      if (*(size_t *)
           ((long)&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Utilities +
           0x28) == 0) {
        return (cmValue)(_Base_ptr)0x0;
      }
      if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
         (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_),
         iVar5 != 0)) {
        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
      }
      if ((GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_ == '\0') &&
         (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                       utilities_abi_cxx11_), iVar5 != 0)) {
        GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __cxa_atexit(std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~vector,&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
               *(size_t *)
                ((long)&((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Utilities
                + 0x28));
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      p_Var9 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->Utilities + 0x18);
      this_01 = GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (p_Var9 != (_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->Utilities + 8U)) {
        std::__cxx11::string::string((string *)fileSetTypes,(string *)(p_Var9 + 1));
        std::__cxx11::string::operator=((string *)this_01,(string *)fileSetTypes);
        std::__cxx11::string::~string((string *)fileSetTypes);
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        this_01 = this_01 + 1;
      }
      __return_storage_ptr__ = (string *)fileSetTypes;
      cmList::
      to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (__return_storage_ptr__,
                 &GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
      this_02 = (undefined1 *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
      goto LAB_002de40f;
    }
    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::propIMPORTED_abi_cxx11_);
    if (_Var3) {
      bVar4 = IsImported(this);
    }
    else {
      _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
      if (!_Var3) {
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propNAME_abi_cxx11_);
        if (_Var3) {
          return (cmValue)(_Base_ptr)
                          &((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Name;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
        if (_Var3) {
          cmMakefile::GetStateSnapshot
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          cmStateSnapshot::GetDirectory((cmStateDirectory *)fileSetTypes,&local_400);
          p_Var8 = (_Base_ptr)
                   cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)fileSetTypes);
          return (cmValue)p_Var8;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
        if (_Var3) {
          cmMakefile::GetStateSnapshot
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          cmStateSnapshot::GetDirectory((cmStateDirectory *)fileSetTypes,&local_400);
          p_Var8 = (_Base_ptr)
                   cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)fileSetTypes);
          return (cmValue)p_Var8;
        }
        goto LAB_002de1ba;
      }
      bVar4 = IsImportedGloballyVisible(this);
    }
    if (bVar4 != false) {
      return (cmValue)(anonymous_namespace)::propTRUE_abi_cxx11_;
    }
    return (cmValue)(anonymous_namespace)::propFALSE_abi_cxx11_;
  }
LAB_002de1ba:
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  fileSetTypes[0] = &(_Var1._M_head_impl)->HeadersFileSets;
  fileSetTypes[1] = &(_Var1._M_head_impl)->CxxModulesFileSets;
  lVar11 = 0;
  do {
    if (lVar11 == 0x10) {
      cVar10 = cmPropertyMap::GetPropertyValue
                         (&((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Properties,prop);
      if (cVar10.Value != (string *)0x0) {
        return (cmValue)cVar10.Value;
      }
      this_00 = cmMakefile::GetState
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Makefile);
      bVar4 = cmState::IsPropertyChained(this_00,prop,TARGET);
      if (bVar4) {
        cmMakefile::GetStateSnapshot
                  (((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)&fileSetName,(cmStateSnapshot *)fileSetTypes);
        cVar10 = cmStateDirectory::GetProperty((cmStateDirectory *)&fileSetName,prop,true);
        return (cmValue)cVar10.Value;
      }
      return (cmValue)(_Base_ptr)0x0;
    }
    __t = *(string_view **)((long)fileSetTypes + lVar11);
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    __x_00._M_str = (prop->_M_dataplus)._M_p;
    __x_00._M_len = prop->_M_string_length;
    bVar4 = std::operator==(__x_00,__t[1]);
    if (bVar4) {
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&fileSetName,(static_string_view *)__t,(allocator<char> *)&local_400);
      this_02 = (undefined1 *)
                cmTargetInternals::GetFileSetDirectories(_Var1._M_head_impl,this,&fileSetName,*__t);
      goto LAB_002de457;
    }
    __x_01._M_str = (prop->_M_dataplus)._M_p;
    __x_01._M_len = prop->_M_string_length;
    bVar4 = std::operator==(__x_01,__t[2]);
    if (bVar4) {
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&fileSetName,(static_string_view *)__t,(allocator<char> *)&local_400);
      this_02 = (undefined1 *)
                cmTargetInternals::GetFileSetPaths(_Var1._M_head_impl,this,&fileSetName,*__t);
      goto LAB_002de457;
    }
    __x_02._M_str = (prop->_M_dataplus)._M_p;
    __x_02._M_len = prop->_M_string_length;
    bVar4 = std::operator==(__x_02,__t[8]);
    if (bVar4) {
      if (((anonymous_namespace)::FileSetType::
           ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
           output_abi_cxx11_ == '\0') &&
         (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::FileSetType::
                                       ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                                       ::output_abi_cxx11_), iVar5 != 0)) {
        (anonymous_namespace)::FileSetType::
        ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
        output_abi_cxx11_._0_8_ = 0xa37518;
        (anonymous_namespace)::FileSetType::
        ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
        output_abi_cxx11_._8_8_ = 0;
        (anonymous_namespace)::FileSetType::
        ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
        output_abi_cxx11_[0x10] = 0;
        __cxa_atexit(std::__cxx11::string::~string,
                     (anonymous_namespace)::FileSetType::
                     ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                     ::output_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::FileSetType::
                             ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                             ::output_abi_cxx11_);
      }
      __return_storage_ptr__ = &fileSetName;
      cmList::
      to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                (__return_storage_ptr__,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(__t + 9));
      this_02 = (anonymous_namespace)::FileSetType::
                ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                ::output_abi_cxx11_;
      goto LAB_002de40f;
    }
    __x_03._M_str = (prop->_M_dataplus)._M_p;
    __x_03._M_len = prop->_M_string_length;
    bVar4 = std::operator==(__x_03,*(basic_string_view<char,_std::char_traits<char>_> *)
                                    &__t[10]._M_str);
    if (bVar4) {
      if (((anonymous_namespace)::FileSetType::
           ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
           output_abi_cxx11_ == '\0') &&
         (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::FileSetType::
                                       ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                                       ::output_abi_cxx11_), iVar5 != 0)) {
        (anonymous_namespace)::FileSetType::
        ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
        output_abi_cxx11_._0_8_ = 0xa37540;
        (anonymous_namespace)::FileSetType::
        ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
        output_abi_cxx11_._8_8_ = 0;
        (anonymous_namespace)::FileSetType::
        ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
        output_abi_cxx11_[0x10] = 0;
        __cxa_atexit(std::__cxx11::string::~string,
                     (anonymous_namespace)::FileSetType::
                     ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                     ::output_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::FileSetType::
                             ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                             ::output_abi_cxx11_);
      }
      __return_storage_ptr__ = &fileSetName;
      cmList::
      to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                (__return_storage_ptr__,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__t[0xb]._M_str);
      this_02 = (anonymous_namespace)::FileSetType::
                ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                ::output_abi_cxx11_;
      goto LAB_002de40f;
    }
    str._M_str = (prop->_M_dataplus)._M_p;
    str._M_len = prop->_M_string_length;
    bVar4 = cmHasPrefix(str,__t[3]);
    if (bVar4) {
      std::__cxx11::string::substr((ulong)&fileSetName,(ulong)prop);
      if (fileSetName._M_string_length == 0) goto LAB_002de475;
      this_02 = (undefined1 *)
                cmTargetInternals::GetFileSetDirectories(_Var1._M_head_impl,this,&fileSetName,*__t);
      goto LAB_002de457;
    }
    str_00._M_str = (prop->_M_dataplus)._M_p;
    str_00._M_len = prop->_M_string_length;
    bVar4 = cmHasPrefix(str_00,__t[4]);
    lVar11 = lVar11 + 8;
  } while (!bVar4);
  std::__cxx11::string::substr((ulong)&fileSetName,(ulong)prop);
  if (fileSetName._M_string_length == 0) {
LAB_002de475:
    this_02 = (undefined1 *)0x0;
  }
  else {
    this_02 = (undefined1 *)
              cmTargetInternals::GetFileSetPaths(_Var1._M_head_impl,this,&fileSetName,*__t);
  }
LAB_002de457:
  __return_storage_ptr__ = &fileSetName;
LAB_002de45c:
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  return (cmValue)(string *)this_02;
code_r0x002ddf6f:
  pbVar2 = *(basic_string_view<char,_std::char_traits<char>_> **)
            ((long)&fileSetName._M_dataplus._M_p + lVar11);
  __x._M_str = (prop->_M_dataplus)._M_p;
  __x._M_len = prop->_M_string_length;
  bVar4 = std::operator==(__x,*pbVar2);
  lVar11 = lVar11 + 8;
  if (bVar4) goto code_r0x002ddf8f;
  goto LAB_002ddf66;
code_r0x002ddf8f:
  if (pbVar2[1]._M_str == (char *)pbVar2[2]._M_len) {
    return (cmValue)(_Base_ptr)0x0;
  }
  if (((anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)::
       output_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::UsageRequirementProperty::
                                   Read(std::__cxx11::string_const&)::output_abi_cxx11_), iVar5 != 0
     )) {
    (anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)::
    output_abi_cxx11_._0_8_ = 0xa374f0;
    (anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)::
    output_abi_cxx11_._8_8_ = 0;
    (anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)::
    output_abi_cxx11_[0x10] = 0;
    __cxa_atexit(std::__cxx11::string::~string,
                 (anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)
                 ::output_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::UsageRequirementProperty::
                         Read(std::__cxx11::string_const&)::output_abi_cxx11_);
  }
  __return_storage_ptr__ = (string *)fileSetTypes;
  cmList::
  to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
            (__return_storage_ptr__,
             (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&pbVar2[1]._M_str);
  this_02 = (anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)::
            output_abi_cxx11_;
LAB_002de40f:
  std::__cxx11::string::operator=((string *)this_02,(string *)__return_storage_ptr__);
  goto LAB_002de45c;
}

Assistant:

cmValue cmTarget::GetProperty(const std::string& prop) const
{
  static std::unordered_set<std::string> const specialProps{
    propC_STANDARD,
    propCXX_STANDARD,
    propCUDA_STANDARD,
    propHIP_STANDARD,
    propOBJC_STANDARD,
    propOBJCXX_STANDARD,
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propPRECOMPILE_HEADERS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES,
    propINTERFACE_LINK_LIBRARIES,
    propINTERFACE_LINK_LIBRARIES_DIRECT,
    propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
    propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES,
    propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS,
    propIMPORTED_CXX_MODULES_COMPILE_FEATURES,
    propIMPORTED_CXX_MODULES_COMPILE_OPTIONS,
    propIMPORTED_CXX_MODULES_LINK_LIBRARIES,
  };
  if (specialProps.count(prop)) {
    if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
        prop == propCUDA_STANDARD || prop == propHIP_STANDARD ||
        prop == propOBJC_STANDARD || prop == propOBJCXX_STANDARD) {
      auto propertyIter = this->impl->LanguageStandardProperties.find(prop);
      if (propertyIter == this->impl->LanguageStandardProperties.end()) {
        return nullptr;
      }
      return cmValue(propertyIter->second.Value);
    }

    UsageRequirementProperty const* usageRequirements[] = {
      &this->impl->IncludeDirectories,
      &this->impl->CompileOptions,
      &this->impl->CompileFeatures,
      &this->impl->CompileDefinitions,
      &this->impl->PrecompileHeaders,
      &this->impl->Sources,
      &this->impl->LinkOptions,
      &this->impl->LinkDirectories,
      &this->impl->LinkLibraries,
      &this->impl->InterfaceLinkLibraries,
      &this->impl->InterfaceLinkLibrariesDirect,
      &this->impl->InterfaceLinkLibrariesDirectExclude,
      &this->impl->ImportedCxxModulesIncludeDirectories,
      &this->impl->ImportedCxxModulesCompileDefinitions,
      &this->impl->ImportedCxxModulesCompileFeatures,
      &this->impl->ImportedCxxModulesCompileOptions,
      &this->impl->ImportedCxxModulesLinkLibraries,
    };

    for (auto const* usageRequirement : usageRequirements) {
      auto value = usageRequirement->Read(prop);
      if (value.first) {
        return value.second;
      }
    }

    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmValue(cmState::GetTargetTypeName(this->GetType()));
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (this->impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      static std::vector<std::string> utilities;
      utilities.resize(this->impl->Utilities.size());
      std::transform(
        this->impl->Utilities.cbegin(), this->impl->Utilities.cend(),
        utilities.begin(),
        [](const BT<std::pair<std::string, bool>>& item) -> std::string {
          return item.Value.first;
        });
      output = cmList::to_string(utilities);
      return cmValue(output);
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? cmValue(propTRUE) : cmValue(propFALSE);
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? cmValue(propTRUE)
                                               : cmValue(propFALSE);
    }
    if (prop == propNAME) {
      return cmValue(this->GetName());
    }
    if (prop == propBINARY_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentBinary());
    }
    if (prop == propSOURCE_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentSource());
    }
  }

  // Check fileset properties.
  {
    FileSetType* fileSetTypes[] = {
      &this->impl->HeadersFileSets,
      &this->impl->CxxModulesFileSets,
    };

    for (auto* fileSetType : fileSetTypes) {
      auto value = fileSetType->ReadProperties(this, this->impl.get(), prop);
      if (value.first) {
        return value.second;
      }
    }
  }

  cmValue retVal = this->impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain = this->impl->Makefile->GetState()->IsPropertyChained(
      prop, cmProperty::TARGET);
    if (chain) {
      return this->impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetProperty(prop, chain);
    }
    return nullptr;
  }
  return retVal;
}